

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void jmp_list_patch(Parser *psr,int head_idx,int target_idx)

{
  uint uVar1;
  FnScope *pFVar2;
  Function *pFVar3;
  BcIns *pBVar4;
  uint uVar5;
  
  if (-1 < head_idx) {
    pFVar2 = psr->scope;
    pFVar3 = psr->vm->fns;
    do {
      pBVar4 = pFVar3[pFVar2->fn].ins;
      uVar1 = pBVar4[(uint)head_idx];
      uVar5 = ((uVar1 >> 8) + head_idx) - 0x7fffff;
      pBVar4[(uint)head_idx] = (target_idx - head_idx) * 0x100 + 0x7fffff00 + (uVar1 & 0xff);
      head_idx = uVar5;
    } while (-1 < (int)uVar5);
  }
  return;
}

Assistant:

static void jmp_list_patch(Parser *psr, int head_idx, int target_idx) {
	if (head_idx < 0) {
		// Don't do anything if the list is empty
	} else if (jmp_follow(psr, head_idx) == -1) {
		// We've reached the last element in the jump list
		jmp_set_target(psr, head_idx, target_idx);
	} else {
		// Preserve the next JMP in the list
		int next_idx = jmp_follow(psr, head_idx);
		jmp_set_target(psr, head_idx, target_idx);

		// Do the recursive call last so hopefully the compiler can do a tail
		// call optimisation
		jmp_list_patch(psr, next_idx, target_idx);
	}
}